

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this)

{
  JsonClassBase<cfd::api::json::DecodeRawTransactionResponse> *in_RDI;
  JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>
  *in_stack_ffffffffffffffa0;
  allocator local_1d [20];
  allocator local_9 [9];
  
  core::JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>::JsonClassBase(in_RDI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__DecodeRawTransactionResponse_009f7aa0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x640385);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 7),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0xb),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  *(undefined4 *)&in_RDI[0xf]._vptr_JsonClassBase = 0;
  *(undefined4 *)((long)&in_RDI[0xf]._vptr_JsonClassBase + 4) = 0;
  *(undefined4 *)&in_RDI[0x10]._vptr_JsonClassBase = 0;
  *(undefined4 *)((long)&in_RDI[0x10]._vptr_JsonClassBase + 4) = 0;
  *(undefined4 *)&in_RDI[0x11]._vptr_JsonClassBase = 0;
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxIn,_DecodeRawTransactionTxInStruct>::
  JsonObjectVector(in_stack_ffffffffffffffa0);
  core::JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
  ::JsonObjectVector((JsonObjectVector<cfd::api::json::DecodeRawTransactionTxOut,_DecodeRawTransactionTxOutStruct>
                      *)(in_RDI + 0x16));
  CollectFieldName();
  return;
}

Assistant:

DecodeRawTransactionResponse() {
    CollectFieldName();
  }